

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::ast::ValueSymbol_*,_const_slang::ast::ValueSymbol_*,_std::hash<const_slang::ast::ValueSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::ValueSymbol_*>_>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::ValueSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>_>
::sherwood_v3_table(sherwood_v3_table<const_slang::ast::ValueSymbol_*,_const_slang::ast::ValueSymbol_*,_std::hash<const_slang::ast::ValueSymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::ValueSymbol_*>_>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::ValueSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>_>
                    *this,StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>
                          *alloc)

{
  sherwood_v3_entry<const_slang::ast::ValueSymbol_*> *psVar1;
  
  (this->
  super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::ValueSymbol_*>,_8UL>).
  storage = alloc->storage;
  psVar1 = empty_default_table<slang::ast::ValueSymbol_const*>();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = 0.5;
  this->num_elements = 0;
  return;
}

Assistant:

explicit sherwood_v3_table(const ArgumentAlloc & alloc)
        : EntryAlloc(alloc)
    {
    }